

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearizer.c
# Opt level: O0

void linearize_function(LinearizerState *linearizer)

{
  Proc *proc_00;
  AstNode *pAVar1;
  _Bool _Var2;
  Instruction *insn_00;
  Pseudo *pseudo;
  Instruction *insn;
  AstNode *func_expr;
  Proc *proc;
  LinearizerState *linearizer_local;
  
  proc_00 = linearizer->current_proc;
  if (proc_00 == (Proc *)0x0) {
    __assert_fail("proc != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi-compiler/src/linearizer.c"
                  ,0xbe4,"void linearize_function(LinearizerState *)");
  }
  pAVar1 = proc_00->function_expr;
  if (pAVar1->type != EXPR_FUNCTION) {
    __assert_fail("func_expr->type == EXPR_FUNCTION",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi-compiler/src/linearizer.c"
                  ,0xbe6,"void linearize_function(LinearizerState *)");
  }
  initialize_graph(proc_00);
  if (proc_00->node_count < 2) {
    __assert_fail("proc->node_count >= 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi-compiler/src/linearizer.c"
                  ,0xbe8,"void linearize_function(LinearizerState *)");
  }
  if (*proc_00->nodes != (BasicBlock *)0x0) {
    if (proc_00->nodes[1] != (BasicBlock *)0x0) {
      start_scope(linearizer,proc_00,(pAVar1->field_2).function_expr.main_block);
      linearize_function_args(linearizer);
      linearize_statement_list(proc_00,(pAVar1->field_2).function_expr.function_statement_list);
      end_scope(linearizer,proc_00,pAVar1->line_number);
      _Var2 = is_block_terminated(proc_00->current_bb);
      if (!_Var2) {
        insn_00 = allocate_instruction(proc_00,op_ret,pAVar1->line_number);
        pseudo = allocate_block_pseudo(proc_00,proc_00->nodes[1]);
        add_instruction_target(proc_00,insn_00,pseudo);
        add_instruction(proc_00,insn_00);
      }
      return;
    }
    __assert_fail("proc->nodes[EXIT_BLOCK] != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi-compiler/src/linearizer.c"
                  ,0xbea,"void linearize_function(LinearizerState *)");
  }
  __assert_fail("proc->nodes[ENTRY_BLOCK] != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi-compiler/src/linearizer.c"
                ,0xbe9,"void linearize_function(LinearizerState *)");
}

Assistant:

static void linearize_function(LinearizerState *linearizer)
{
	Proc *proc = linearizer->current_proc;
	assert(proc != NULL);
	AstNode *func_expr = proc->function_expr;
	assert(func_expr->type == EXPR_FUNCTION);
	initialize_graph(proc);
	assert(proc->node_count >= 2);
	assert(proc->nodes[ENTRY_BLOCK] != NULL);
	assert(proc->nodes[EXIT_BLOCK] != NULL);
	start_scope(linearizer, proc, func_expr->function_expr.main_block);
	linearize_function_args(linearizer);
	linearize_statement_list(proc, func_expr->function_expr.function_statement_list);
	end_scope(linearizer, proc, func_expr->line_number);
	if (!is_block_terminated(proc->current_bb)) {
		Instruction *insn = allocate_instruction(proc, op_ret, func_expr->line_number);
		add_instruction_target(proc, insn, allocate_block_pseudo(proc, proc->nodes[EXIT_BLOCK]));
		add_instruction(proc, insn);
	}
}